

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  float *vertices;
  undefined1 (*pauVar35) [16];
  AABBNodeMB4D *node1;
  ulong uVar37;
  long lVar38;
  long lVar39;
  RTCRayQueryContext *pRVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  int *piVar43;
  undefined1 (*pauVar44) [16];
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar66 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar84;
  float fVar95;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  undefined1 auVar92 [32];
  float fVar96;
  float fVar106;
  float fVar107;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar108;
  undefined1 auVar105 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar117 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float fVar124;
  undefined1 auVar123 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  float fVar128;
  float fVar130;
  uint uVar131;
  float fVar132;
  uint uVar133;
  float fVar134;
  uint uVar135;
  undefined1 auVar129 [64];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  int local_2694;
  undefined1 local_2690 [8];
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2680 [8];
  float fStack_2678;
  float fStack_2674;
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  RayQueryContext *local_2648;
  Scene *local_2640;
  long local_2638;
  RTCFilterFunctionNArguments local_2630;
  undefined1 local_2600 [8];
  float fStack_25f8;
  float fStack_25f4;
  ulong local_25f0;
  long local_25e8;
  ulong local_25e0;
  ulong local_25d8;
  undefined4 local_25d0;
  uint local_25cc;
  uint local_25c8;
  float local_25c4;
  float local_25c0;
  undefined4 local_25bc;
  uint local_25b8;
  uint local_25b4;
  uint local_25b0;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2530 [16];
  float local_2520 [4];
  float local_2510 [4];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined1 local_24c0 [8];
  float fStack_24b8;
  float fStack_24b4;
  undefined1 local_24b0 [8];
  float fStack_24a8;
  float fStack_24a4;
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar36;
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2648 = context;
    pauVar35 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar70 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar58 = (ray->super_RayK<1>).tfar;
    auVar83 = ZEXT464((uint)fVar58);
    auVar85 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar58));
    auVar99._8_4_ = 0x7fffffff;
    auVar99._0_8_ = 0x7fffffff7fffffff;
    auVar99._12_4_ = 0x7fffffff;
    auVar99 = vandps_avx((undefined1  [16])aVar4,auVar99);
    auVar115._8_4_ = 0x219392ef;
    auVar115._0_8_ = 0x219392ef219392ef;
    auVar115._12_4_ = 0x219392ef;
    auVar99 = vcmpps_avx(auVar99,auVar115,1);
    auVar99 = vblendvps_avx((undefined1  [16])aVar4,auVar115,auVar99);
    auVar115 = vrcpps_avx(auVar99);
    fVar58 = auVar115._0_4_;
    auVar97._0_4_ = auVar99._0_4_ * fVar58;
    fVar67 = auVar115._4_4_;
    auVar97._4_4_ = auVar99._4_4_ * fVar67;
    fVar68 = auVar115._8_4_;
    auVar97._8_4_ = auVar99._8_4_ * fVar68;
    fVar69 = auVar115._12_4_;
    auVar97._12_4_ = auVar99._12_4_ * fVar69;
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar99 = vsubps_avx(auVar116,auVar97);
    uVar34 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar34;
    local_23c0._0_4_ = uVar34;
    local_23c0._8_4_ = uVar34;
    local_23c0._12_4_ = uVar34;
    local_23c0._16_4_ = uVar34;
    local_23c0._20_4_ = uVar34;
    local_23c0._24_4_ = uVar34;
    local_23c0._28_4_ = uVar34;
    auVar123 = ZEXT3264(local_23c0);
    uVar34 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar34;
    local_23e0._0_4_ = uVar34;
    local_23e0._8_4_ = uVar34;
    local_23e0._12_4_ = uVar34;
    local_23e0._16_4_ = uVar34;
    local_23e0._20_4_ = uVar34;
    local_23e0._24_4_ = uVar34;
    local_23e0._28_4_ = uVar34;
    auVar127 = ZEXT3264(local_23e0);
    auVar98._0_4_ = fVar58 + fVar58 * auVar99._0_4_;
    auVar98._4_4_ = fVar67 + fVar67 * auVar99._4_4_;
    auVar98._8_4_ = fVar68 + fVar68 * auVar99._8_4_;
    auVar98._12_4_ = fVar69 + fVar69 * auVar99._12_4_;
    uVar34 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar34;
    local_2400._0_4_ = uVar34;
    local_2400._8_4_ = uVar34;
    local_2400._12_4_ = uVar34;
    local_2400._16_4_ = uVar34;
    local_2400._20_4_ = uVar34;
    local_2400._24_4_ = uVar34;
    local_2400._28_4_ = uVar34;
    auVar129 = ZEXT3264(local_2400);
    auVar99 = vshufps_avx(auVar98,auVar98,0);
    local_2420._16_16_ = auVar99;
    local_2420._0_16_ = auVar99;
    auVar137 = ZEXT3264(local_2420);
    auVar99 = vmovshdup_avx(auVar98);
    auVar114 = ZEXT1664(auVar99);
    auVar115 = vshufps_avx(auVar98,auVar98,0x55);
    local_2440._16_16_ = auVar115;
    local_2440._0_16_ = auVar115;
    auVar142 = ZEXT3264(local_2440);
    auVar115 = vshufpd_avx(auVar98,auVar98,1);
    auVar119 = ZEXT1664(auVar115);
    auVar97 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar105 = ZEXT1664(auVar97);
    uVar36 = (ulong)(auVar98._0_4_ < 0.0) << 5;
    uVar52 = (ulong)(auVar99._0_4_ < 0.0) << 5 | 0x40;
    local_2460._16_16_ = auVar97;
    local_2460._0_16_ = auVar97;
    auVar122 = ZEXT3264(local_2460);
    uVar54 = (ulong)(auVar115._0_4_ < 0.0) << 5 | 0x80;
    uVar56 = uVar36 ^ 0x20;
    auVar99 = vshufps_avx(auVar70,auVar70,0);
    local_2480._16_16_ = auVar99;
    local_2480._0_16_ = auVar99;
    auVar144 = ZEXT3264(local_2480);
    auVar99 = vshufps_avx(auVar85,auVar85,0);
    auVar66 = ZEXT3264(CONCAT1616(auVar99,auVar99));
    local_25a0 = mm_lookupmask_ps._240_8_;
    uStack_2598 = mm_lookupmask_ps._248_8_;
    local_25f0 = uVar36;
LAB_014cf25a:
    do {
      pauVar44 = pauVar35 + -1;
      pauVar35 = pauVar35 + -1;
      if (*(float *)(*pauVar44 + 8) <= auVar83._0_4_) {
        uVar57 = *(ulong *)*pauVar35;
        while ((uVar57 & 8) == 0) {
          uVar37 = uVar57 & 0xfffffffffffffff0;
          fVar58 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar92._4_4_ = fVar58;
          auVar92._0_4_ = fVar58;
          auVar92._8_4_ = fVar58;
          auVar92._12_4_ = fVar58;
          auVar92._16_4_ = fVar58;
          auVar92._20_4_ = fVar58;
          auVar92._24_4_ = fVar58;
          auVar92._28_4_ = fVar58;
          pfVar3 = (float *)(uVar37 + 0x100 + uVar36);
          pfVar1 = (float *)(uVar37 + 0x40 + uVar36);
          auVar82._0_4_ = fVar58 * *pfVar3 + *pfVar1;
          auVar82._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
          auVar82._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
          auVar82._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
          auVar82._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
          auVar82._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
          auVar82._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
          auVar82._28_4_ = auVar83._28_4_ + pfVar1[7];
          auVar82 = vsubps_avx(auVar82,auVar123._0_32_);
          auVar23._4_4_ = auVar137._4_4_ * auVar82._4_4_;
          auVar23._0_4_ = auVar137._0_4_ * auVar82._0_4_;
          auVar23._8_4_ = auVar137._8_4_ * auVar82._8_4_;
          auVar23._12_4_ = auVar137._12_4_ * auVar82._12_4_;
          auVar23._16_4_ = auVar137._16_4_ * auVar82._16_4_;
          auVar23._20_4_ = auVar137._20_4_ * auVar82._20_4_;
          auVar23._24_4_ = auVar137._24_4_ * auVar82._24_4_;
          auVar23._28_4_ = auVar82._28_4_;
          auVar82 = vmaxps_avx(auVar144._0_32_,auVar23);
          pfVar3 = (float *)(uVar37 + 0x100 + uVar52);
          pfVar1 = (float *)(uVar37 + 0x40 + uVar52);
          auVar103._0_4_ = fVar58 * *pfVar3 + *pfVar1;
          auVar103._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
          auVar103._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
          auVar103._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
          auVar103._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
          auVar103._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
          auVar103._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
          auVar103._28_4_ = auVar105._28_4_ + pfVar1[7];
          auVar23 = vsubps_avx(auVar103,auVar127._0_32_);
          auVar26._4_4_ = auVar142._4_4_ * auVar23._4_4_;
          auVar26._0_4_ = auVar142._0_4_ * auVar23._0_4_;
          auVar26._8_4_ = auVar142._8_4_ * auVar23._8_4_;
          auVar26._12_4_ = auVar142._12_4_ * auVar23._12_4_;
          auVar26._16_4_ = auVar142._16_4_ * auVar23._16_4_;
          auVar26._20_4_ = auVar142._20_4_ * auVar23._20_4_;
          auVar26._24_4_ = auVar142._24_4_ * auVar23._24_4_;
          auVar26._28_4_ = auVar23._28_4_;
          pfVar3 = (float *)(uVar37 + 0x100 + uVar54);
          pfVar1 = (float *)(uVar37 + 0x40 + uVar54);
          auVar112._0_4_ = fVar58 * *pfVar3 + *pfVar1;
          auVar112._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
          auVar112._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
          auVar112._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
          auVar112._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
          auVar112._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
          auVar112._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
          auVar112._28_4_ = auVar114._28_4_ + pfVar1[7];
          auVar24 = vsubps_avx(auVar112,auVar129._0_32_);
          auVar27._4_4_ = auVar122._4_4_ * auVar24._4_4_;
          auVar27._0_4_ = auVar122._0_4_ * auVar24._0_4_;
          auVar27._8_4_ = auVar122._8_4_ * auVar24._8_4_;
          auVar27._12_4_ = auVar122._12_4_ * auVar24._12_4_;
          auVar27._16_4_ = auVar122._16_4_ * auVar24._16_4_;
          auVar27._20_4_ = auVar122._20_4_ * auVar24._20_4_;
          auVar27._24_4_ = auVar122._24_4_ * auVar24._24_4_;
          auVar27._28_4_ = auVar24._28_4_;
          auVar23 = vmaxps_avx(auVar26,auVar27);
          local_2580 = vmaxps_avx(auVar82,auVar23);
          pfVar3 = (float *)(uVar37 + 0x100 + uVar56);
          pfVar1 = (float *)(uVar37 + 0x40 + uVar56);
          auVar104._0_4_ = fVar58 * *pfVar3 + *pfVar1;
          auVar104._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
          auVar104._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
          auVar104._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
          auVar104._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
          auVar104._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
          auVar104._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
          auVar104._28_4_ = auVar23._28_4_ + pfVar1[7];
          auVar82 = vsubps_avx(auVar104,auVar123._0_32_);
          auVar28._4_4_ = auVar137._4_4_ * auVar82._4_4_;
          auVar28._0_4_ = auVar137._0_4_ * auVar82._0_4_;
          auVar28._8_4_ = auVar137._8_4_ * auVar82._8_4_;
          auVar28._12_4_ = auVar137._12_4_ * auVar82._12_4_;
          auVar28._16_4_ = auVar137._16_4_ * auVar82._16_4_;
          auVar28._20_4_ = auVar137._20_4_ * auVar82._20_4_;
          auVar28._24_4_ = auVar137._24_4_ * auVar82._24_4_;
          auVar28._28_4_ = auVar82._28_4_;
          pfVar3 = (float *)(uVar37 + 0x100 + (uVar52 ^ 0x20));
          pfVar1 = (float *)(uVar37 + 0x40 + (uVar52 ^ 0x20));
          auVar113._0_4_ = fVar58 * *pfVar3 + *pfVar1;
          auVar113._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
          auVar113._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
          auVar113._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
          auVar113._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
          auVar113._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
          auVar113._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
          auVar113._28_4_ = auVar24._28_4_ + pfVar1[7];
          auVar82 = vsubps_avx(auVar113,auVar127._0_32_);
          auVar24._4_4_ = auVar142._4_4_ * auVar82._4_4_;
          auVar24._0_4_ = auVar142._0_4_ * auVar82._0_4_;
          auVar24._8_4_ = auVar142._8_4_ * auVar82._8_4_;
          auVar24._12_4_ = auVar142._12_4_ * auVar82._12_4_;
          auVar24._16_4_ = auVar142._16_4_ * auVar82._16_4_;
          auVar24._20_4_ = auVar142._20_4_ * auVar82._20_4_;
          auVar24._24_4_ = auVar142._24_4_ * auVar82._24_4_;
          auVar24._28_4_ = auVar82._28_4_;
          pfVar3 = (float *)(uVar37 + 0x100 + (uVar54 ^ 0x20));
          pfVar1 = (float *)(uVar37 + 0x40 + (uVar54 ^ 0x20));
          auVar118._0_4_ = fVar58 * *pfVar3 + *pfVar1;
          auVar118._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
          auVar118._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
          auVar118._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
          auVar118._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
          auVar118._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
          auVar118._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
          auVar118._28_4_ = auVar119._28_4_ + pfVar1[7];
          auVar82 = vsubps_avx(auVar118,auVar129._0_32_);
          auVar29._4_4_ = auVar122._4_4_ * auVar82._4_4_;
          auVar29._0_4_ = auVar122._0_4_ * auVar82._0_4_;
          auVar29._8_4_ = auVar122._8_4_ * auVar82._8_4_;
          auVar29._12_4_ = auVar122._12_4_ * auVar82._12_4_;
          auVar29._16_4_ = auVar122._16_4_ * auVar82._16_4_;
          auVar29._20_4_ = auVar122._20_4_ * auVar82._20_4_;
          auVar29._24_4_ = auVar122._24_4_ * auVar82._24_4_;
          auVar29._28_4_ = auVar82._28_4_;
          auVar119 = ZEXT3264(auVar29);
          auVar23 = vminps_avx(auVar24,auVar29);
          auVar82 = vminps_avx(auVar66._0_32_,auVar28);
          auVar82 = vminps_avx(auVar82,auVar23);
          auVar82 = vcmpps_avx(local_2580,auVar82,2);
          if (((uint)uVar57 & 7) == 6) {
            auVar23 = vcmpps_avx(*(undefined1 (*) [32])(uVar37 + 0x1c0),auVar92,2);
            auVar24 = vcmpps_avx(auVar92,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
            auVar24 = vandps_avx(auVar23,auVar24);
            auVar82 = vandps_avx(auVar24,auVar82);
            auVar99 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
          }
          else {
            auVar99 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
          }
          auVar114 = ZEXT3264(auVar23);
          auVar99 = vpsllw_avx(auVar99,0xf);
          auVar105 = ZEXT1664(auVar99);
          if ((((((((auVar99 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar99 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar99 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar99 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar99[0xf]) {
            auVar99 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar83 = ZEXT1664(auVar99);
            if (pauVar35 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014cf25a;
          }
          auVar99 = vpacksswb_avx(auVar99,auVar99);
          auVar83 = ZEXT1664(auVar99);
          bVar25 = SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar99 >> 0x17,0) & 1) << 2 | (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar99 >> 0x27,0) & 1) << 4 | (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar99 >> 0x37,0) & 1) << 6 | SUB161(auVar99 >> 0x3f,0) << 7;
          lVar38 = 0;
          if (bVar25 != 0) {
            for (; (bVar25 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
            }
          }
          uVar57 = *(ulong *)(uVar37 + lVar38 * 8);
          uVar49 = bVar25 - 1 & (uint)bVar25;
          if (uVar49 != 0) {
            uVar131 = *(uint *)(local_2580 + lVar38 * 4);
            lVar38 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
              }
            }
            uVar41 = *(ulong *)(uVar37 + lVar38 * 8);
            uVar133 = *(uint *)(local_2580 + lVar38 * 4);
            uVar49 = uVar49 - 1 & uVar49;
            if (uVar49 == 0) {
              if (uVar131 < uVar133) {
                *(ulong *)*pauVar35 = uVar41;
                *(uint *)(*pauVar35 + 8) = uVar133;
                pauVar35 = pauVar35 + 1;
              }
              else {
                *(ulong *)*pauVar35 = uVar57;
                *(uint *)(*pauVar35 + 8) = uVar131;
                pauVar35 = pauVar35 + 1;
                uVar57 = uVar41;
              }
            }
            else {
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar57;
              auVar99 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar131));
              auVar85._8_8_ = 0;
              auVar85._0_8_ = uVar41;
              auVar70 = vpunpcklqdq_avx(auVar85,ZEXT416(uVar133));
              lVar38 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                }
              }
              auVar100._8_8_ = 0;
              auVar100._0_8_ = *(ulong *)(uVar37 + lVar38 * 8);
              auVar85 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_2580 + lVar38 * 4)));
              auVar105 = ZEXT1664(auVar85);
              uVar49 = uVar49 - 1 & uVar49;
              if (uVar49 == 0) {
                auVar115 = vpcmpgtd_avx(auVar70,auVar99);
                auVar97 = vpshufd_avx(auVar115,0xaa);
                auVar115 = vblendvps_avx(auVar70,auVar99,auVar97);
                auVar99 = vblendvps_avx(auVar99,auVar70,auVar97);
                auVar70 = vpcmpgtd_avx(auVar85,auVar115);
                auVar97 = vpshufd_avx(auVar70,0xaa);
                auVar70 = vblendvps_avx(auVar85,auVar115,auVar97);
                auVar114 = ZEXT1664(auVar70);
                auVar85 = vblendvps_avx(auVar115,auVar85,auVar97);
                auVar115 = vpcmpgtd_avx(auVar85,auVar99);
                auVar97 = vpshufd_avx(auVar115,0xaa);
                auVar105 = ZEXT1664(auVar97);
                auVar115 = vblendvps_avx(auVar85,auVar99,auVar97);
                auVar119 = ZEXT1664(auVar115);
                auVar99 = vblendvps_avx(auVar99,auVar85,auVar97);
                auVar83 = ZEXT1664(auVar99);
                *pauVar35 = auVar99;
                pauVar35[1] = auVar115;
                uVar57 = auVar70._0_8_;
                pauVar35 = pauVar35 + 2;
              }
              else {
                lVar38 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                auVar119 = ZEXT464(*(uint *)(local_2580 + lVar38 * 4));
                auVar109._8_8_ = 0;
                auVar109._0_8_ = *(ulong *)(uVar37 + lVar38 * 8);
                auVar115 = vpunpcklqdq_avx(auVar109,ZEXT416(*(uint *)(local_2580 + lVar38 * 4)));
                auVar114 = ZEXT1664(auVar115);
                uVar49 = uVar49 - 1 & uVar49;
                uVar41 = (ulong)uVar49;
                if (uVar49 == 0) {
                  auVar97 = vpcmpgtd_avx(auVar70,auVar99);
                  auVar98 = vpshufd_avx(auVar97,0xaa);
                  auVar97 = vblendvps_avx(auVar70,auVar99,auVar98);
                  auVar99 = vblendvps_avx(auVar99,auVar70,auVar98);
                  auVar70 = vpcmpgtd_avx(auVar115,auVar85);
                  auVar98 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar115,auVar85,auVar98);
                  auVar85 = vblendvps_avx(auVar85,auVar115,auVar98);
                  auVar115 = vpcmpgtd_avx(auVar85,auVar99);
                  auVar98 = vpshufd_avx(auVar115,0xaa);
                  auVar115 = vblendvps_avx(auVar85,auVar99,auVar98);
                  auVar114 = ZEXT1664(auVar115);
                  auVar99 = vblendvps_avx(auVar99,auVar85,auVar98);
                  auVar83 = ZEXT1664(auVar99);
                  auVar85 = vpcmpgtd_avx(auVar70,auVar97);
                  auVar98 = vpshufd_avx(auVar85,0xaa);
                  auVar85 = vblendvps_avx(auVar70,auVar97,auVar98);
                  auVar105 = ZEXT1664(auVar85);
                  auVar70 = vblendvps_avx(auVar97,auVar70,auVar98);
                  auVar97 = vpcmpgtd_avx(auVar115,auVar70);
                  auVar98 = vpshufd_avx(auVar97,0xaa);
                  auVar119 = ZEXT1664(auVar98);
                  auVar97 = vblendvps_avx(auVar115,auVar70,auVar98);
                  auVar70 = vblendvps_avx(auVar70,auVar115,auVar98);
                  *pauVar35 = auVar99;
                  pauVar35[1] = auVar70;
                  pauVar35[2] = auVar97;
                  uVar57 = auVar85._0_8_;
                  pauVar44 = pauVar35 + 3;
                }
                else {
                  *pauVar35 = auVar99;
                  pauVar35[1] = auVar70;
                  pauVar35[2] = auVar85;
                  pauVar35[3] = auVar115;
                  lVar38 = 0x30;
                  do {
                    lVar39 = lVar38;
                    lVar38 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    uVar57 = *(ulong *)(uVar37 + lVar38 * 8);
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar57;
                    auVar99 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_2580 + lVar38 * 4)));
                    auVar83 = ZEXT1664(auVar99);
                    *(undefined1 (*) [16])(pauVar35[1] + lVar39) = auVar99;
                    uVar41 = uVar41 & uVar41 - 1;
                    lVar38 = lVar39 + 0x10;
                  } while (uVar41 != 0);
                  pauVar44 = (undefined1 (*) [16])(pauVar35[1] + lVar39);
                  if (lVar39 + 0x10 != 0) {
                    lVar38 = 0x10;
                    pauVar42 = pauVar35;
                    do {
                      auVar99 = pauVar42[1];
                      auVar83 = ZEXT1664(auVar99);
                      pauVar42 = pauVar42 + 1;
                      uVar49 = vextractps_avx(auVar99,2);
                      lVar39 = lVar38;
                      do {
                        if (uVar49 <= *(uint *)(pauVar35[-1] + lVar39 + 8)) {
                          pauVar45 = (undefined1 (*) [16])(*pauVar35 + lVar39);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar35 + lVar39) =
                             *(undefined1 (*) [16])(pauVar35[-1] + lVar39);
                        lVar39 = lVar39 + -0x10;
                        pauVar45 = pauVar35;
                      } while (lVar39 != 0);
                      *pauVar45 = auVar99;
                      lVar38 = lVar38 + 0x10;
                    } while (pauVar44 != pauVar42);
                    uVar57 = *(ulong *)*pauVar44;
                  }
                }
                auVar122 = ZEXT3264(auVar122._0_32_);
                auVar144 = ZEXT3264(auVar144._0_32_);
                pauVar35 = pauVar44;
              }
            }
          }
        }
        local_25e8 = (ulong)((uint)uVar57 & 0xf) - 8;
        if (local_25e8 != 0) {
          uVar57 = uVar57 & 0xfffffffffffffff0;
          local_2640 = local_2648->scene;
          local_2638 = 0;
          do {
            lVar53 = local_2638 * 0x50;
            pGVar6 = (local_2640->geometries).items[*(uint *)(uVar57 + 0x30 + lVar53)].ptr;
            fVar58 = (pGVar6->time_range).lower;
            fVar58 = pGVar6->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar58) /
                     ((pGVar6->time_range).upper - fVar58));
            auVar99 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
            auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar60 = vmaxss_avx(ZEXT816(0),auVar99);
            lVar39 = (long)(int)auVar60._0_4_ * 0x38;
            uVar55 = (ulong)*(uint *)(uVar57 + 4 + lVar53);
            lVar38 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar39);
            lVar39 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar39);
            auVar99 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar57 + lVar53) * 4);
            uVar37 = (ulong)*(uint *)(uVar57 + 0x10 + lVar53);
            auVar70 = *(undefined1 (*) [16])(lVar38 + uVar37 * 4);
            uVar41 = (ulong)*(uint *)(uVar57 + 0x20 + lVar53);
            auVar62 = *(undefined1 (*) [16])(lVar38 + uVar41 * 4);
            auVar85 = *(undefined1 (*) [16])(lVar38 + uVar55 * 4);
            uVar46 = (ulong)*(uint *)(uVar57 + 0x14 + lVar53);
            auVar115 = *(undefined1 (*) [16])(lVar38 + uVar46 * 4);
            uVar47 = (ulong)*(uint *)(uVar57 + 0x24 + lVar53);
            auVar72 = *(undefined1 (*) [16])(lVar38 + uVar47 * 4);
            uVar48 = (ulong)*(uint *)(uVar57 + 8 + lVar53);
            auVar97 = *(undefined1 (*) [16])(lVar38 + uVar48 * 4);
            local_25d8 = (ulong)*(uint *)(uVar57 + 0x18 + lVar53);
            auVar98 = *(undefined1 (*) [16])(lVar38 + local_25d8 * 4);
            uVar50 = (ulong)*(uint *)(uVar57 + 0x28 + lVar53);
            auVar116 = *(undefined1 (*) [16])(lVar38 + uVar50 * 4);
            uVar51 = (ulong)*(uint *)(uVar57 + 0xc + lVar53);
            auVar100 = *(undefined1 (*) [16])(lVar38 + uVar51 * 4);
            local_25e0 = (ulong)*(uint *)(uVar57 + 0x1c + lVar53);
            auVar109 = *(undefined1 (*) [16])(lVar38 + local_25e0 * 4);
            uVar36 = (ulong)*(uint *)(uVar57 + 0x2c + lVar53);
            auVar71 = *(undefined1 (*) [16])(lVar38 + uVar36 * 4);
            auVar5 = *(undefined1 (*) [16])(lVar39 + (ulong)*(uint *)(uVar57 + lVar53) * 4);
            auVar59 = *(undefined1 (*) [16])(lVar39 + uVar37 * 4);
            fVar58 = fVar58 - auVar60._0_4_;
            auVar60 = vunpcklps_avx(auVar99,auVar97);
            auVar97 = vunpckhps_avx(auVar99,auVar97);
            auVar61 = vunpcklps_avx(auVar85,auVar100);
            auVar85 = vunpckhps_avx(auVar85,auVar100);
            auVar99 = *(undefined1 (*) [16])(lVar39 + uVar55 * 4);
            _local_24b0 = vunpcklps_avx(auVar97,auVar85);
            auVar32 = _local_24b0;
            auVar100 = vunpcklps_avx(auVar60,auVar61);
            auVar97 = vunpckhps_avx(auVar60,auVar61);
            auVar60 = vunpcklps_avx(auVar70,auVar98);
            auVar85 = vunpckhps_avx(auVar70,auVar98);
            auVar98 = vunpcklps_avx(auVar115,auVar109);
            auVar115 = vunpckhps_avx(auVar115,auVar109);
            auVar70 = *(undefined1 (*) [16])(lVar39 + uVar48 * 4);
            auVar109 = vunpcklps_avx(auVar85,auVar115);
            auVar61 = vunpcklps_avx(auVar60,auVar98);
            _local_24c0 = vunpckhps_avx(auVar60,auVar98);
            auVar31 = _local_24c0;
            auVar60 = vunpcklps_avx(auVar62,auVar116);
            auVar115 = vunpckhps_avx(auVar62,auVar116);
            auVar116 = vunpcklps_avx(auVar72,auVar71);
            auVar98 = vunpckhps_avx(auVar72,auVar71);
            auVar85 = *(undefined1 (*) [16])(lVar39 + uVar51 * 4);
            auVar71 = vunpcklps_avx(auVar115,auVar98);
            _local_24a0 = vunpcklps_avx(auVar60,auVar116);
            auVar33 = _local_24a0;
            _local_2600 = vunpckhps_avx(auVar60,auVar116);
            auVar65 = _local_2600;
            auVar115 = vunpcklps_avx(auVar5,auVar70);
            auVar70 = vunpckhps_avx(auVar5,auVar70);
            auVar98 = vunpcklps_avx(auVar99,auVar85);
            auVar85 = vunpckhps_avx(auVar99,auVar85);
            auVar99 = *(undefined1 (*) [16])(lVar39 + local_25d8 * 4);
            auVar116 = vunpcklps_avx(auVar70,auVar85);
            auVar5 = vunpcklps_avx(auVar115,auVar98);
            auVar85 = vunpckhps_avx(auVar115,auVar98);
            auVar98 = vunpcklps_avx(auVar59,auVar99);
            auVar115 = vunpckhps_avx(auVar59,auVar99);
            auVar99 = *(undefined1 (*) [16])(lVar39 + uVar46 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar39 + local_25e0 * 4);
            auVar59 = vunpcklps_avx(auVar99,auVar70);
            auVar99 = vunpckhps_avx(auVar99,auVar70);
            auVar60 = vunpcklps_avx(auVar115,auVar99);
            auVar62 = vunpcklps_avx(auVar98,auVar59);
            auVar115 = vunpckhps_avx(auVar98,auVar59);
            auVar99 = *(undefined1 (*) [16])(lVar39 + uVar41 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar39 + uVar50 * 4);
            auVar59 = vunpcklps_avx(auVar99,auVar70);
            auVar98 = vunpckhps_avx(auVar99,auVar70);
            auVar99 = *(undefined1 (*) [16])(lVar39 + uVar47 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar39 + uVar36 * 4);
            auVar72 = vunpcklps_avx(auVar99,auVar70);
            auVar99 = vunpckhps_avx(auVar99,auVar70);
            auVar73 = vunpcklps_avx(auVar98,auVar99);
            auVar74 = vunpcklps_avx(auVar59,auVar72);
            auVar98 = vunpckhps_avx(auVar59,auVar72);
            auVar99 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
            auVar70 = vshufps_avx(ZEXT416((uint)(1.0 - fVar58)),ZEXT416((uint)(1.0 - fVar58)),0);
            fVar58 = auVar99._0_4_;
            fVar67 = auVar99._4_4_;
            fVar68 = auVar99._8_4_;
            fVar69 = auVar99._12_4_;
            fVar124 = auVar70._0_4_;
            fVar145 = auVar70._4_4_;
            fVar146 = auVar70._8_4_;
            fVar147 = auVar70._12_4_;
            auVar117._0_4_ = fVar124 * auVar100._0_4_ + fVar58 * auVar5._0_4_;
            auVar117._4_4_ = fVar145 * auVar100._4_4_ + fVar67 * auVar5._4_4_;
            auVar117._8_4_ = fVar146 * auVar100._8_4_ + fVar68 * auVar5._8_4_;
            auVar117._12_4_ = fVar147 * auVar100._12_4_ + fVar69 * auVar5._12_4_;
            auVar120._0_4_ = fVar124 * auVar97._0_4_ + fVar58 * auVar85._0_4_;
            auVar120._4_4_ = fVar145 * auVar97._4_4_ + fVar67 * auVar85._4_4_;
            auVar120._8_4_ = fVar146 * auVar97._8_4_ + fVar68 * auVar85._8_4_;
            auVar120._12_4_ = fVar147 * auVar97._12_4_ + fVar69 * auVar85._12_4_;
            auVar110._0_4_ = fVar124 * (float)local_24b0._0_4_ + fVar58 * auVar116._0_4_;
            auVar110._4_4_ = fVar145 * (float)local_24b0._4_4_ + fVar67 * auVar116._4_4_;
            auVar110._8_4_ = fVar146 * fStack_24a8 + fVar68 * auVar116._8_4_;
            auVar110._12_4_ = fVar147 * fStack_24a4 + fVar69 * auVar116._12_4_;
            auVar72._0_4_ = fVar124 * auVar61._0_4_ + fVar58 * auVar62._0_4_;
            auVar72._4_4_ = fVar145 * auVar61._4_4_ + fVar67 * auVar62._4_4_;
            auVar72._8_4_ = fVar146 * auVar61._8_4_ + fVar68 * auVar62._8_4_;
            auVar72._12_4_ = fVar147 * auVar61._12_4_ + fVar69 * auVar62._12_4_;
            auVar86._0_4_ = fVar124 * (float)local_24c0._0_4_ + fVar58 * auVar115._0_4_;
            auVar86._4_4_ = fVar145 * (float)local_24c0._4_4_ + fVar67 * auVar115._4_4_;
            auVar86._8_4_ = fVar146 * fStack_24b8 + fVar68 * auVar115._8_4_;
            auVar86._12_4_ = fVar147 * fStack_24b4 + fVar69 * auVar115._12_4_;
            puVar2 = (undefined8 *)(uVar57 + 0x30 + lVar53);
            local_2490 = *puVar2;
            uStack_2488 = puVar2[1];
            puVar2 = (undefined8 *)(uVar57 + 0x40 + lVar53);
            local_2680._0_4_ = auVar109._0_4_;
            local_2680._4_4_ = auVar109._4_4_;
            fStack_2678 = auVar109._8_4_;
            fStack_2674 = auVar109._12_4_;
            auVar125._0_4_ = fVar124 * (float)local_2680._0_4_ + auVar60._0_4_ * fVar58;
            auVar125._4_4_ = fVar145 * (float)local_2680._4_4_ + auVar60._4_4_ * fVar67;
            auVar125._8_4_ = fVar146 * fStack_2678 + auVar60._8_4_ * fVar68;
            auVar125._12_4_ = fVar147 * fStack_2674 + auVar60._12_4_ * fVar69;
            auVar141._0_4_ = fVar124 * (float)local_24a0._0_4_ + auVar74._0_4_ * fVar58;
            auVar141._4_4_ = fVar145 * (float)local_24a0._4_4_ + auVar74._4_4_ * fVar67;
            auVar141._8_4_ = fVar146 * fStack_2498 + auVar74._8_4_ * fVar68;
            auVar141._12_4_ = fVar147 * fStack_2494 + auVar74._12_4_ * fVar69;
            auVar143._0_4_ = auVar98._0_4_ * fVar58 + fVar124 * (float)local_2600._0_4_;
            auVar143._4_4_ = auVar98._4_4_ * fVar67 + fVar145 * (float)local_2600._4_4_;
            auVar143._8_4_ = auVar98._8_4_ * fVar68 + fVar146 * fStack_25f8;
            auVar143._12_4_ = auVar98._12_4_ * fVar69 + fVar147 * fStack_25f4;
            local_2690._0_4_ = auVar71._0_4_;
            local_2690._4_4_ = auVar71._4_4_;
            fStack_2688 = auVar71._8_4_;
            fStack_2684 = auVar71._12_4_;
            auVar59._0_4_ = fVar124 * (float)local_2690._0_4_ + auVar73._0_4_ * fVar58;
            auVar59._4_4_ = fVar145 * (float)local_2690._4_4_ + auVar73._4_4_ * fVar67;
            auVar59._8_4_ = fVar146 * fStack_2688 + auVar73._8_4_ * fVar68;
            auVar59._12_4_ = fVar147 * fStack_2684 + auVar73._12_4_ * fVar69;
            local_2590 = *puVar2;
            uStack_2588 = puVar2[1];
            auVar99 = vsubps_avx(auVar117,auVar72);
            auVar70 = vsubps_avx(auVar120,auVar86);
            auVar85 = vsubps_avx(auVar110,auVar125);
            auVar115 = vsubps_avx(auVar141,auVar117);
            auVar97 = vsubps_avx(auVar143,auVar120);
            auVar98 = vsubps_avx(auVar59,auVar110);
            fVar69 = auVar98._0_4_;
            fVar128 = auVar70._0_4_;
            auVar60._0_4_ = fVar128 * fVar69;
            fVar8 = auVar98._4_4_;
            fVar130 = auVar70._4_4_;
            auVar60._4_4_ = fVar130 * fVar8;
            fVar13 = auVar98._8_4_;
            fVar132 = auVar70._8_4_;
            auVar60._8_4_ = fVar132 * fVar13;
            fVar18 = auVar98._12_4_;
            fVar134 = auVar70._12_4_;
            auVar60._12_4_ = fVar134 * fVar18;
            fVar124 = auVar97._0_4_;
            fVar136 = auVar85._0_4_;
            auVar73._0_4_ = fVar136 * fVar124;
            fVar9 = auVar97._4_4_;
            fVar138 = auVar85._4_4_;
            auVar73._4_4_ = fVar138 * fVar9;
            fVar14 = auVar97._8_4_;
            fVar139 = auVar85._8_4_;
            auVar73._8_4_ = fVar139 * fVar14;
            fVar19 = auVar97._12_4_;
            fVar140 = auVar85._12_4_;
            auVar73._12_4_ = fVar140 * fVar19;
            local_24f0 = vsubps_avx(auVar73,auVar60);
            fVar145 = auVar115._0_4_;
            auVar74._0_4_ = fVar136 * fVar145;
            fVar10 = auVar115._4_4_;
            auVar74._4_4_ = fVar138 * fVar10;
            fVar15 = auVar115._8_4_;
            auVar74._8_4_ = fVar139 * fVar15;
            fVar20 = auVar115._12_4_;
            auVar74._12_4_ = fVar140 * fVar20;
            fVar146 = auVar99._0_4_;
            auVar87._0_4_ = fVar69 * fVar146;
            fVar11 = auVar99._4_4_;
            auVar87._4_4_ = fVar8 * fVar11;
            fVar16 = auVar99._8_4_;
            auVar87._8_4_ = fVar13 * fVar16;
            fVar21 = auVar99._12_4_;
            auVar87._12_4_ = fVar18 * fVar21;
            auVar85 = vsubps_avx(auVar87,auVar74);
            auVar88._0_4_ = fVar124 * fVar146;
            auVar88._4_4_ = fVar9 * fVar11;
            auVar88._8_4_ = fVar14 * fVar16;
            auVar88._12_4_ = fVar19 * fVar21;
            auVar101._0_4_ = fVar128 * fVar145;
            auVar101._4_4_ = fVar130 * fVar10;
            auVar101._8_4_ = fVar132 * fVar15;
            auVar101._12_4_ = fVar134 * fVar20;
            auVar115 = vsubps_avx(auVar101,auVar88);
            uVar34 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar102._4_4_ = uVar34;
            auVar102._0_4_ = uVar34;
            auVar102._8_4_ = uVar34;
            auVar102._12_4_ = uVar34;
            uVar34 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar61._4_4_ = uVar34;
            auVar61._0_4_ = uVar34;
            auVar61._8_4_ = uVar34;
            auVar61._12_4_ = uVar34;
            uVar34 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar148._4_4_ = uVar34;
            auVar148._0_4_ = uVar34;
            auVar148._8_4_ = uVar34;
            auVar148._12_4_ = uVar34;
            fVar58 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_2670 = vsubps_avx(auVar117,auVar102);
            fVar67 = (ray->super_RayK<1>).dir.field_0.m128[2];
            _local_2680 = vsubps_avx(auVar120,auVar61);
            auVar105 = ZEXT1664(_local_2680);
            _local_2690 = vsubps_avx(auVar110,auVar148);
            fVar147 = local_2690._0_4_;
            auVar111._0_4_ = fVar58 * fVar147;
            fVar12 = local_2690._4_4_;
            auVar111._4_4_ = fVar58 * fVar12;
            fVar17 = local_2690._8_4_;
            auVar111._8_4_ = fVar58 * fVar17;
            fVar22 = local_2690._12_4_;
            auVar111._12_4_ = fVar58 * fVar22;
            fVar96 = local_2680._0_4_;
            auVar149._0_4_ = fVar96 * fVar67;
            fVar106 = local_2680._4_4_;
            auVar149._4_4_ = fVar106 * fVar67;
            fVar107 = local_2680._8_4_;
            auVar149._8_4_ = fVar107 * fVar67;
            fVar108 = local_2680._12_4_;
            auVar149._12_4_ = fVar108 * fVar67;
            auVar70 = vsubps_avx(auVar149,auVar111);
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar84 = local_2670._0_4_;
            auVar62._0_4_ = fVar84 * fVar67;
            fVar93 = local_2670._4_4_;
            auVar62._4_4_ = fVar93 * fVar67;
            fVar94 = local_2670._8_4_;
            auVar62._8_4_ = fVar94 * fVar67;
            fVar95 = local_2670._12_4_;
            auVar62._12_4_ = fVar95 * fVar67;
            auVar75._0_4_ = fVar147 * fVar68;
            auVar75._4_4_ = fVar12 * fVar68;
            auVar75._8_4_ = fVar17 * fVar68;
            auVar75._12_4_ = fVar22 * fVar68;
            auVar97 = vsubps_avx(auVar75,auVar62);
            auVar76._0_4_ = fVar96 * fVar68;
            auVar76._4_4_ = fVar106 * fVar68;
            auVar76._8_4_ = fVar107 * fVar68;
            auVar76._12_4_ = fVar108 * fVar68;
            auVar89._0_4_ = fVar58 * fVar84;
            auVar89._4_4_ = fVar58 * fVar93;
            auVar89._8_4_ = fVar58 * fVar94;
            auVar89._12_4_ = fVar58 * fVar95;
            auVar98 = vsubps_avx(auVar89,auVar76);
            auVar90._0_4_ =
                 local_24f0._0_4_ * fVar68 + fVar58 * auVar85._0_4_ + auVar115._0_4_ * fVar67;
            auVar90._4_4_ =
                 local_24f0._4_4_ * fVar68 + fVar58 * auVar85._4_4_ + auVar115._4_4_ * fVar67;
            auVar90._8_4_ =
                 local_24f0._8_4_ * fVar68 + fVar58 * auVar85._8_4_ + auVar115._8_4_ * fVar67;
            auVar90._12_4_ =
                 local_24f0._12_4_ * fVar68 + fVar58 * auVar85._12_4_ + auVar115._12_4_ * fVar67;
            auVar77._8_8_ = 0x8000000080000000;
            auVar77._0_8_ = 0x8000000080000000;
            auVar99 = vandps_avx(auVar90,auVar77);
            uVar49 = auVar99._0_4_;
            local_2580._0_4_ =
                 (float)(uVar49 ^ (uint)(fVar145 * auVar70._0_4_ +
                                        fVar124 * auVar97._0_4_ + fVar69 * auVar98._0_4_));
            uVar131 = auVar99._4_4_;
            local_2580._4_4_ =
                 (float)(uVar131 ^
                        (uint)(fVar10 * auVar70._4_4_ +
                              fVar9 * auVar97._4_4_ + fVar8 * auVar98._4_4_));
            uVar133 = auVar99._8_4_;
            local_2580._8_4_ =
                 (float)(uVar133 ^
                        (uint)(fVar15 * auVar70._8_4_ +
                              fVar14 * auVar97._8_4_ + fVar13 * auVar98._8_4_));
            uVar135 = auVar99._12_4_;
            local_2580._12_4_ =
                 (float)(uVar135 ^
                        (uint)(fVar20 * auVar70._12_4_ +
                              fVar19 * auVar97._12_4_ + fVar18 * auVar98._12_4_));
            auVar114 = ZEXT1664(local_2580._0_16_);
            local_2580._16_4_ =
                 (float)(uVar49 ^ (uint)(auVar70._0_4_ * fVar146 +
                                        fVar128 * auVar97._0_4_ + fVar136 * auVar98._0_4_));
            local_2580._20_4_ =
                 (float)(uVar131 ^
                        (uint)(auVar70._4_4_ * fVar11 +
                              fVar130 * auVar97._4_4_ + fVar138 * auVar98._4_4_));
            local_2580._24_4_ =
                 (float)(uVar133 ^
                        (uint)(auVar70._8_4_ * fVar16 +
                              fVar132 * auVar97._8_4_ + fVar139 * auVar98._8_4_));
            local_2580._28_4_ =
                 (float)(uVar135 ^
                        (uint)(auVar70._12_4_ * fVar21 +
                              fVar134 * auVar97._12_4_ + fVar140 * auVar98._12_4_));
            auVar119 = ZEXT1664(local_2580._16_16_);
            auVar97 = ZEXT816(0) << 0x20;
            auVar99 = vcmpps_avx(local_2580._0_16_,auVar97,5);
            auVar70 = vcmpps_avx(local_2580._16_16_,auVar97,5);
            auVar99 = vandps_avx(auVar99,auVar70);
            auVar78._8_4_ = 0x7fffffff;
            auVar78._0_8_ = 0x7fffffff7fffffff;
            auVar78._12_4_ = 0x7fffffff;
            local_2550 = vandps_avx(auVar90,auVar78);
            auVar70 = vcmpps_avx(auVar97,auVar90,4);
            auVar99 = vandps_avx(auVar99,auVar70);
            auVar79._0_4_ = local_2580._0_4_ + local_2580._16_4_;
            auVar79._4_4_ = local_2580._4_4_ + local_2580._20_4_;
            auVar79._8_4_ = local_2580._8_4_ + local_2580._24_4_;
            auVar79._12_4_ = local_2580._12_4_ + local_2580._28_4_;
            auVar70 = vcmpps_avx(auVar79,local_2550,2);
            auVar99 = vandps_avx(auVar99,auVar70);
            auVar5._8_8_ = uStack_2598;
            auVar5._0_8_ = local_25a0;
            auVar5 = auVar5 & auVar99;
            if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar5 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar5 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar5[0xf] < '\0') {
              auVar30._8_8_ = uStack_2598;
              auVar30._0_8_ = local_25a0;
              auVar99 = vandps_avx(auVar99,auVar30);
              local_2560._0_4_ =
                   (float)(uVar49 ^ (uint)(local_24f0._0_4_ * fVar84 +
                                          fVar96 * auVar85._0_4_ + fVar147 * auVar115._0_4_));
              local_2560._4_4_ =
                   (float)(uVar131 ^
                          (uint)(local_24f0._4_4_ * fVar93 +
                                fVar106 * auVar85._4_4_ + fVar12 * auVar115._4_4_));
              local_2560._8_4_ =
                   (float)(uVar133 ^
                          (uint)(local_24f0._8_4_ * fVar94 +
                                fVar107 * auVar85._8_4_ + fVar17 * auVar115._8_4_));
              local_2560._12_4_ =
                   (float)(uVar135 ^
                          (uint)(local_24f0._12_4_ * fVar95 +
                                fVar108 * auVar85._12_4_ + fVar22 * auVar115._12_4_));
              fVar58 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar67 = local_2550._0_4_;
              auVar63._0_4_ = fVar67 * fVar58;
              fVar68 = local_2550._4_4_;
              auVar63._4_4_ = fVar68 * fVar58;
              fVar69 = local_2550._8_4_;
              auVar63._8_4_ = fVar69 * fVar58;
              fVar124 = local_2550._12_4_;
              auVar63._12_4_ = fVar124 * fVar58;
              auVar70 = vcmpps_avx(auVar63,local_2560,1);
              fVar58 = (ray->super_RayK<1>).tfar;
              auVar80._0_4_ = fVar67 * fVar58;
              auVar80._4_4_ = fVar68 * fVar58;
              auVar80._8_4_ = fVar69 * fVar58;
              auVar80._12_4_ = fVar124 * fVar58;
              auVar97 = vcmpps_avx(local_2560,auVar80,2);
              auVar70 = vandps_avx(auVar97,auVar70);
              auVar105 = ZEXT1664(auVar70);
              auVar97 = auVar99 & auVar70;
              if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar97[0xf] < '\0') {
                auVar126._0_4_ = (ray->super_RayK<1>).tfar;
                auVar126._4_4_ = (ray->super_RayK<1>).mask;
                auVar126._8_4_ = (ray->super_RayK<1>).id;
                auVar126._12_4_ = (ray->super_RayK<1>).flags;
                auVar99 = vandps_avx(auVar99,auVar70);
                local_2530 = auVar99;
                local_26e0 = auVar85._0_8_;
                uStack_26d8 = auVar85._8_8_;
                local_24e0 = local_26e0;
                uStack_24d8 = uStack_26d8;
                local_26c0 = auVar115._0_8_;
                uStack_26b8 = auVar115._8_8_;
                local_24d0 = local_26c0;
                uStack_24c8 = uStack_26b8;
                local_2660 = auVar99;
                auVar70 = vrcpps_avx(local_2550);
                fVar58 = auVar70._0_4_;
                auVar81._0_4_ = fVar67 * fVar58;
                fVar67 = auVar70._4_4_;
                auVar81._4_4_ = fVar68 * fVar67;
                fVar68 = auVar70._8_4_;
                auVar81._8_4_ = fVar69 * fVar68;
                fVar69 = auVar70._12_4_;
                auVar81._12_4_ = fVar124 * fVar69;
                auVar91._8_4_ = 0x3f800000;
                auVar91._0_8_ = 0x3f8000003f800000;
                auVar91._12_4_ = 0x3f800000;
                auVar70 = vsubps_avx(auVar91,auVar81);
                fVar58 = fVar58 + fVar58 * auVar70._0_4_;
                fVar67 = fVar67 + fVar67 * auVar70._4_4_;
                fVar68 = fVar68 + fVar68 * auVar70._8_4_;
                fVar69 = fVar69 + fVar69 * auVar70._12_4_;
                auVar121._0_4_ = fVar58 * local_2560._0_4_;
                auVar121._4_4_ = fVar67 * local_2560._4_4_;
                auVar121._8_4_ = fVar68 * local_2560._8_4_;
                auVar121._12_4_ = fVar69 * local_2560._12_4_;
                local_2500 = auVar121;
                local_2520[0] = fVar58 * local_2580._0_4_;
                local_2520[1] = fVar67 * local_2580._4_4_;
                local_2520[2] = fVar68 * local_2580._8_4_;
                local_2520[3] = fVar69 * local_2580._12_4_;
                local_2510[0] = fVar58 * local_2580._16_4_;
                local_2510[1] = fVar67 * local_2580._20_4_;
                local_2510[2] = fVar68 * local_2580._24_4_;
                local_2510[3] = fVar69 * local_2580._28_4_;
                auVar64._8_4_ = 0x7f800000;
                auVar64._0_8_ = 0x7f8000007f800000;
                auVar64._12_4_ = 0x7f800000;
                auVar70 = vblendvps_avx(auVar64,auVar121,auVar99);
                auVar85 = vshufps_avx(auVar70,auVar70,0xb1);
                auVar85 = vminps_avx(auVar85,auVar70);
                auVar115 = vshufpd_avx(auVar85,auVar85,1);
                auVar85 = vminps_avx(auVar115,auVar85);
                auVar70 = vcmpps_avx(auVar70,auVar85,0);
                auVar85 = auVar99 & auVar70;
                if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar85[0xf] < '\0') {
                  auVar99 = vandps_avx(auVar70,auVar99);
                }
                auVar105 = ZEXT1664(auVar99);
                uVar49 = vextractps_avx(auVar126,1);
                uVar34 = vmovmskps_avx(auVar99);
                uVar36 = CONCAT44((int)((ulong)local_2638 >> 0x20),uVar34);
                piVar43 = (int *)0x0;
                _local_2600 = auVar65;
                _local_24c0 = auVar31;
                _local_24b0 = auVar32;
                _local_24a0 = auVar33;
                if (uVar36 != 0) {
                  for (; (uVar36 >> (long)piVar43 & 1) == 0; piVar43 = (int *)((long)piVar43 + 1)) {
                  }
                }
                do {
                  uVar131 = *(uint *)((long)&local_2490 + (long)piVar43 * 4);
                  pGVar6 = (local_2640->geometries).items[uVar131].ptr;
                  if ((pGVar6->mask & uVar49) == 0) {
                    *(undefined4 *)(local_2660 + (long)piVar43 * 4) = 0;
                  }
                  else {
                    pRVar7 = local_2648->args;
                    if (pRVar7->filter == (RTCFilterFunctionN)0x0) {
                      pRVar40 = local_2648->user;
                      if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar58 = local_2520[(long)piVar43];
                        fVar67 = local_2510[(long)piVar43];
                        (ray->super_RayK<1>).tfar = *(float *)(local_2500 + (long)piVar43 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_24f0 + (long)piVar43 * 4);
                        (ray->Ng).field_0.field_0.y =
                             *(float *)((long)&local_24e0 + (long)piVar43 * 4);
                        (ray->Ng).field_0.field_0.z =
                             *(float *)((long)&local_24d0 + (long)piVar43 * 4);
                        ray->u = fVar58;
                        ray->v = fVar67;
                        ray->primID = *(uint *)((long)&local_2590 + (long)piVar43 * 4);
                        ray->geomID = uVar131;
                        ray->instID[0] = pRVar40->instID[0];
                        ray->instPrimID[0] = pRVar40->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar40 = local_2648->user;
                    }
                    local_25cc = *(uint *)((long)&local_24e0 + (long)piVar43 * 4);
                    auVar105 = ZEXT464(local_25cc);
                    local_25c8 = *(uint *)((long)&local_24d0 + (long)piVar43 * 4);
                    auVar114 = ZEXT464(local_25c8);
                    local_25d0 = *(undefined4 *)(local_24f0 + (long)piVar43 * 4);
                    local_25c4 = local_2520[(long)piVar43];
                    local_25c0 = local_2510[(long)piVar43];
                    local_25bc = *(undefined4 *)((long)&local_2590 + (long)piVar43 * 4);
                    local_25b8 = uVar131;
                    local_25b4 = pRVar40->instID[0];
                    local_25b0 = pRVar40->instPrimID[0];
                    local_2670._0_8_ = piVar43;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2500 + (long)piVar43 * 4);
                    local_2694 = -1;
                    local_2630.valid = &local_2694;
                    local_2630.geometryUserPtr = pGVar6->userPtr;
                    local_2630.context = pRVar40;
                    local_2630.ray = (RTCRayN *)ray;
                    local_2630.hit = (RTCHitN *)&local_25d0;
                    local_2630.N = 1;
                    local_2680 = (undefined1  [8])pGVar6;
                    if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014cff15:
                      if ((pRVar7->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_2680 + 0x3e) & 0x40) != 0)))) {
                        auVar105 = ZEXT1664(auVar105._0_16_);
                        auVar114 = ZEXT1664(auVar114._0_16_);
                        auVar119 = ZEXT1664(auVar119._0_16_);
                        (*pRVar7->filter)(&local_2630);
                        if (*local_2630.valid == 0) goto LAB_014cffb0;
                      }
                      (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2630.hit;
                      (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2630.hit + 4);
                      (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2630.hit + 8);
                      *(float *)((long)local_2630.ray + 0x3c) = *(float *)(local_2630.hit + 0xc);
                      *(float *)((long)local_2630.ray + 0x40) = *(float *)(local_2630.hit + 0x10);
                      *(float *)((long)local_2630.ray + 0x44) = *(float *)(local_2630.hit + 0x14);
                      *(float *)((long)local_2630.ray + 0x48) = *(float *)(local_2630.hit + 0x18);
                      *(float *)((long)local_2630.ray + 0x4c) = *(float *)(local_2630.hit + 0x1c);
                      *(float *)((long)local_2630.ray + 0x50) = *(float *)(local_2630.hit + 0x20);
                    }
                    else {
                      auVar105 = ZEXT464(local_25cc);
                      auVar114 = ZEXT464(local_25c8);
                      auVar119 = ZEXT1664(auVar119._0_16_);
                      (*pGVar6->intersectionFilterN)(&local_2630);
                      if (*local_2630.valid != 0) goto LAB_014cff15;
LAB_014cffb0:
                      local_26e0._0_4_ = auVar126._0_4_;
                      (ray->super_RayK<1>).tfar = (float)local_26e0;
                    }
                    *(undefined4 *)(local_2660 + local_2670._0_8_ * 4) = 0;
                    fVar58 = (ray->super_RayK<1>).tfar;
                    auVar65._4_4_ = fVar58;
                    auVar65._0_4_ = fVar58;
                    auVar65._8_4_ = fVar58;
                    auVar65._12_4_ = fVar58;
                    auVar99 = vcmpps_avx(auVar121,auVar65,2);
                    local_2660 = vandps_avx(auVar99,local_2660);
                    auVar126._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar126._4_4_ = (ray->super_RayK<1>).mask;
                    auVar126._8_4_ = (ray->super_RayK<1>).id;
                    auVar126._12_4_ = (ray->super_RayK<1>).flags;
                    uVar49 = vextractps_avx(auVar126,1);
                  }
                  if ((((local_2660 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2660 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2660 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2660[0xf]) break;
                  auVar105 = ZEXT1664(auVar105._0_16_);
                  auVar114 = ZEXT1664(auVar114._0_16_);
                  auVar119 = ZEXT1664(auVar119._0_16_);
                  BVHNIntersector1<8,16777232,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_2630);
                  piVar43 = local_2630.valid;
                } while( true );
              }
            }
            local_2638 = local_2638 + 1;
          } while (local_2638 != local_25e8);
        }
        fVar58 = (ray->super_RayK<1>).tfar;
        auVar66 = ZEXT3264(CONCAT428(fVar58,CONCAT424(fVar58,CONCAT420(fVar58,CONCAT416(fVar58,
                                                  CONCAT412(fVar58,CONCAT48(fVar58,CONCAT44(fVar58,
                                                  fVar58))))))));
        auVar83 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar123 = ZEXT3264(local_23c0);
        auVar127 = ZEXT3264(local_23e0);
        auVar129 = ZEXT3264(local_2400);
        auVar137 = ZEXT3264(local_2420);
        auVar142 = ZEXT3264(local_2440);
        auVar122 = ZEXT3264(local_2460);
        auVar144 = ZEXT3264(local_2480);
        uVar36 = local_25f0;
      }
    } while (pauVar35 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }